

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ContinuousAssignSymbol::ContinuousAssignSymbol
          (ContinuousAssignSymbol *this,ExpressionSyntax *syntax)

{
  Token local_40;
  SourceLocation local_30;
  string_view local_28;
  SyntaxNode *local_18;
  ExpressionSyntax *syntax_local;
  ContinuousAssignSymbol *this_local;
  
  local_18 = &syntax->super_SyntaxNode;
  syntax_local = (ExpressionSyntax *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"");
  local_40 = slang::syntax::SyntaxNode::getFirstToken(local_18);
  local_30 = parsing::Token::location(&local_40);
  Symbol::Symbol(&this->super_Symbol,ContinuousAssign,local_28,local_30);
  this->assign = (Expression *)0x0;
  std::optional<const_slang::ast::TimingControl_*>::optional(&this->delay);
  Symbol::setSyntax(&this->super_Symbol,local_18);
  return;
}

Assistant:

ContinuousAssignSymbol::ContinuousAssignSymbol(const ExpressionSyntax& syntax) :
    Symbol(SymbolKind::ContinuousAssign, "", syntax.getFirstToken().location()) {

    setSyntax(syntax);
}